

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# graphcycles.cc
# Opt level: O0

void __thiscall
absl::lts_20250127::synchronization_internal::GraphCycles::RemoveEdge
          (GraphCycles *this,GraphId x,GraphId y)

{
  int32_t iVar1;
  Node *pNVar2;
  Node *pNVar3;
  Node *yn;
  Node *xn;
  GraphCycles *this_local;
  GraphId y_local;
  GraphId x_local;
  
  pNVar2 = FindNode(this->rep_,x);
  pNVar3 = FindNode(this->rep_,y);
  if ((pNVar2 != (Node *)0x0) && (pNVar3 != (Node *)0x0)) {
    iVar1 = anon_unknown_0::NodeIndex(y);
    anon_unknown_0::NodeSet::erase(&pNVar2->out,iVar1);
    iVar1 = anon_unknown_0::NodeIndex(x);
    anon_unknown_0::NodeSet::erase(&pNVar3->in,iVar1);
  }
  return;
}

Assistant:

void GraphCycles::RemoveEdge(GraphId x, GraphId y) {
  Node* xn = FindNode(rep_, x);
  Node* yn = FindNode(rep_, y);
  if (xn && yn) {
    xn->out.erase(NodeIndex(y));
    yn->in.erase(NodeIndex(x));
    // No need to update the rank assignment since a previous valid
    // rank assignment remains valid after an edge deletion.
  }
}